

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLURL::setURL(XMLURL *this,XMLCh *baseURL,XMLCh *relativeURL)

{
  bool bVar1;
  MalformedURLException *this_00;
  undefined1 local_78 [8];
  XMLURL basePart;
  XMLCh *relativeURL_local;
  XMLCh *baseURL_local;
  XMLURL *this_local;
  
  basePart._80_8_ = relativeURL;
  cleanUp(this);
  parse(this,(XMLCh *)basePart._80_8_);
  bVar1 = isRelative(this);
  if (((bVar1) && (baseURL != (XMLCh *)0x0)) && (*baseURL != L'\0')) {
    XMLURL((XMLURL *)local_78,baseURL,this->fMemoryManager);
    bVar1 = conglomerateWithBase(this,(XMLURL *)local_78,false);
    if (!bVar1) {
      cleanUp(this);
      this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x204,URL_RelativeBaseURL,this->fMemoryManager);
      __cxa_throw(this_00,&MalformedURLException::typeinfo,
                  MalformedURLException::~MalformedURLException);
    }
    ~XMLURL((XMLURL *)local_78);
  }
  return;
}

Assistant:

void XMLURL::setURL(const XMLCh* const    baseURL
                  , const XMLCh* const    relativeURL)
{
    cleanUp();

    // Parse our URL string
    parse(relativeURL);

	//
	//  If its relative and the base is non-null and non-empty, then
	//  parse the base URL string and conglomerate them.
	//
	if (isRelative() && baseURL)
	{
		if (*baseURL)
		{
			XMLURL basePart(baseURL, fMemoryManager);
			if (!conglomerateWithBase(basePart, false))
			{
				cleanUp();
				ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_RelativeBaseURL, fMemoryManager);
			}
		}
	}
}